

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::device_tree::resolve_cross_references(device_tree *this,uint32_t *phandle)

{
  pointer *pprVar1;
  property_value *ppVar2;
  pointer ppVar3;
  pointer pcVar4;
  pointer psVar5;
  element_type *peVar6;
  size_t sVar7;
  iterator __position;
  byte_buffer *this_00;
  string *psVar8;
  undefined8 uVar9;
  int iVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  mapped_type *pmVar11;
  reference_wrapper<dtc::fdt::device_tree::fixup> *prVar12;
  string *s;
  pointer psVar13;
  fixup *i;
  pointer ppVar14;
  node_ptr target;
  string node_address;
  string node_name;
  string path_1;
  string possible;
  node_ptr next;
  string target_name;
  string path_element;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  sorted_phandles;
  unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
  phandle_set;
  node_path path;
  istringstream nss;
  element_type *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4e0;
  undefined1 *local_4d8;
  size_t local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  undefined1 *local_4b8;
  size_t local_4b0;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_498;
  reference_wrapper<dtc::fdt::device_tree::fixup> *local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 *local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined7 uStack_457;
  element_type *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_440;
  key_type local_438;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined7 uStack_407;
  element_type *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  reference_wrapper<dtc::fdt::device_tree::fixup> *local_3e8;
  reference_wrapper<dtc::fdt::device_tree::fixup> *prStack_3e0;
  long local_3d8;
  bool *local_3c8;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>>>
  *local_3c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_3b8;
  uint32_t *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  _Hashtable<dtc::fdt::property_value_*,_std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>,_std::__detail::_Select1st,_std::equal_to<dtc::fdt::property_value_*>,_std::hash<dtc::fdt::property_value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_368;
  undefined1 local_330 [384];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  prVar12 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)
            (this->cross_references).
            super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_490 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)
              (this->cross_references).
              super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_3b0 = phandle;
  if (prVar12 != local_490) {
    local_498 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->node_paths;
    do {
      ppVar2 = (property_value *)prVar12->_M_data;
      __x = &std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_498,&ppVar2->string_data)->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_330,__x);
      uVar9 = local_330._8_8_;
      if (local_330._0_8_ != local_330._8_8_) {
        if ((pointer)(local_330._0_8_ + 0x40) != (pointer)local_330._8_8_) {
          this_00 = &ppVar2->byte_data;
          s = &((pointer)(local_330._0_8_ + 0x40))->second;
          do {
            local_1b0[0] = (istringstream)0x2f;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (this_00,(uchar *)local_1b0);
            push_string(this_00,s + -1,false);
            if (s->_M_string_length != 0) {
              local_1b0[0] = (istringstream)0x40;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,(uchar *)local_1b0);
              push_string(this_00,s,false);
            }
            psVar8 = s + 1;
            s = s + 2;
          } while (psVar8 != (string *)uVar9);
        }
        local_1b0[0] = (istringstream)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&ppVar2->byte_data,(uchar *)local_1b0);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_330);
      prVar12 = prVar12 + 1;
    } while (prVar12 != local_490);
  }
  local_368._M_buckets = &local_368._M_single_bucket;
  local_368._M_bucket_count = 1;
  local_368._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_368._M_element_count = 0;
  local_368._M_rehash_policy._M_max_load_factor = 1.0;
  local_368._M_rehash_policy._M_next_resize = 0;
  local_368._M_single_bucket = (__node_base_ptr)0x0;
  ppVar14 = (pointer)(this->fixups).
                     super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (pointer)(this->fixups).
                    super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar14 != ppVar3) {
    do {
      local_330._0_8_ = (ppVar14->second)._M_string_length;
      local_330._8_8_ = ppVar14;
      std::
      _Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>
                ((_Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_368,local_330);
      ppVar14 = (pointer)&(ppVar14->second).field_2;
    } while (ppVar14 != ppVar3);
  }
  local_3a8._8_8_ = &local_3e8;
  local_3e8 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)0x0;
  prStack_3e0 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)0x0;
  local_3d8 = 0;
  local_3a8._M_unused._M_object = &local_368;
  local_390 = std::
              _Function_handler<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc:1406:14)>
              ::_M_invoke;
  local_398 = std::
              _Function_handler<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc:1406:14)>
              ::_M_manager;
  node::visit((this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *)
              &local_3a8,(node *)0x0);
  if (local_398 != (code *)0x0) {
    (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
  }
  if ((long)prStack_3e0 - (long)local_3e8 >> 3 !=
      ((long)(this->fixups).
             super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->fixups).
             super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) {
    __assert_fail("sorted_phandles.size() == fixups.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x58d,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
  }
  if (local_3e8 != prStack_3e0) {
    local_490 = prStack_3e0;
    local_498 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->node_names;
    local_3b8 = &(this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    local_3c8 = &this->valid;
    local_3c0 = (vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>>>
                 *)&this->unresolved_fixups;
    prVar12 = local_3e8;
    do {
      ppVar2 = prVar12->_M_data->val;
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      pcVar4 = (ppVar2->string_data)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,pcVar4,pcVar4 + (ppVar2->string_data)._M_string_length);
      _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_468 = &local_458;
      local_460 = 0;
      local_458 = 0;
      if (*local_438._M_dataplus._M_p == '/') {
        local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        local_488._M_string_length = 0;
        local_488.field_2._M_local_buf[0] = '\0';
        local_4e8 = (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_4e0,local_3b8);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_330,(string *)&local_438,_S_in);
        local_418 = &local_408;
        local_410 = 0;
        local_408 = 0;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_330,(string *)&local_418,'/');
        do {
          if ((local_330[(((pointer)(local_330._0_8_ + -0x40))->second)._M_string_length + 0x20] & 2
              ) != 0) break;
          std::__cxx11::string::push_back((char)&local_488);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_330,(string *)&local_418,'/');
          std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_418,_S_in);
          local_4b0 = 0;
          local_4a8 = 0;
          local_4d0 = 0;
          local_4c8 = 0;
          local_4d8 = &local_4c8;
          local_4b8 = &local_4a8;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1b0,(string *)&local_4b8,'@');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1b0,(string *)&local_4d8,'@');
          local_448 = (element_type *)0x0;
          _Stack_440._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          psVar5 = (local_4e8->children).
                   super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar13 = (local_4e8->children).
                         super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar5;
              psVar13 = psVar13 + 1) {
            peVar6 = (psVar13->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            sVar7 = (peVar6->name)._M_string_length;
            if ((sVar7 == local_4b0) &&
               ((sVar7 == 0 ||
                (iVar10 = bcmp((peVar6->name)._M_dataplus._M_p,local_4b8,sVar7), iVar10 == 0)))) {
              sVar7 = (peVar6->unit_address)._M_string_length;
              if ((sVar7 == local_4d0) &&
                 ((sVar7 == 0 ||
                  (iVar10 = bcmp((peVar6->unit_address)._M_dataplus._M_p,local_4d8,sVar7),
                  iVar10 == 0)))) {
                local_448 = peVar6;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&_Stack_440,
                           &(psVar13->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>
                            )._M_refcount);
                break;
              }
              std::operator+(&local_388,&local_488,&peVar6->name);
              std::__cxx11::string::operator=((string *)&local_468,(string *)&local_388);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p,
                                local_388.field_2._M_allocated_capacity + 1);
              }
              if ((((psVar13->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   )->unit_address)._M_string_length != 0) {
                std::__cxx11::string::push_back((char)&local_468);
                std::__cxx11::string::_M_append
                          ((char *)&local_468,
                           (ulong)(((psVar13->
                                    super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->unit_address)._M_dataplus._M_p);
              }
            }
          }
          std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_4b8);
          if (local_4d0 != 0) {
            std::__cxx11::string::push_back((char)&local_488);
            std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_4d8);
          }
          peVar6 = local_448;
          local_4e8 = local_448;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_4e0,&_Stack_440);
          if (_Stack_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_440._M_pi);
          }
          if (local_4d8 != &local_4c8) {
            operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
          }
          if (local_4b8 != &local_4a8) {
            operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
          }
          std::__cxx11::istringstream::~istringstream(local_1b0);
          std::ios_base::~ios_base(local_138);
        } while (peVar6 != (element_type *)0x0);
        if (local_418 != &local_408) {
          operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
        std::ios_base::~ios_base((ios_base *)(local_330 + 0x78));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,
                          CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                                   local_488.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_498,&local_438);
        local_4e8 = (pmVar11->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_4e0,
                   &(pmVar11->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
      }
      if (local_4e8 == (element_type *)0x0) {
        if (this->is_plugin == true) {
          __position._M_current =
               (this->unresolved_fixups).
               super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->unresolved_fixups).
              super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            iVar10 = 10;
            std::
            vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>>>
            ::_M_realloc_insert<std::reference_wrapper<dtc::fdt::device_tree::fixup>const&>
                      (local_3c0,__position,prVar12);
          }
          else {
            (__position._M_current)->_M_data = prVar12->_M_data;
            pprVar1 = &(this->unresolved_fixups).
                       super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pprVar1 = *pprVar1 + 1;
            iVar10 = 10;
          }
        }
        else {
          resolve_cross_references();
          iVar10 = 1;
        }
      }
      else {
        local_3f8 = local_4e8;
        local_3f0 = _Stack_4e0._M_pi;
        if (_Stack_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Stack_4e0._M_pi)->_M_use_count = (_Stack_4e0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Stack_4e0._M_pi)->_M_use_count = (_Stack_4e0._M_pi)->_M_use_count + 1;
          }
        }
        assign_phandle((device_tree *)local_330,(node_ptr *)this,(uint32_t *)&local_3f8);
        if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
        }
        property_value::push_to_buffer
                  (*(property_value **)
                    ((long)&(((pointer)(local_330._0_8_ + 0x40))->first).field_2 + 8),
                   &prVar12->_M_data->val->byte_data);
        ppVar2 = prVar12->_M_data->val;
        if ((long)(ppVar2->byte_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(ppVar2->byte_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != 4) {
          __assert_fail("i.get().val.byte_data.size() == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                        ,0x5e1,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
        }
        if ((pointer)local_330._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._8_8_);
        }
        iVar10 = 0;
      }
      if (local_468 != &local_458) {
        operator_delete(local_468,CONCAT71(uStack_457,local_458) + 1);
      }
      if (_Stack_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_4e0._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
    } while (((iVar10 == 10) || (iVar10 == 0)) && (prVar12 = prVar12 + 1, prVar12 != local_490));
  }
  if (local_3e8 != (reference_wrapper<dtc::fdt::device_tree::fixup> *)0x0) {
    operator_delete(local_3e8,local_3d8 - (long)local_3e8);
  }
  std::
  _Hashtable<dtc::fdt::property_value_*,_std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>,_std::__detail::_Select1st,_std::equal_to<dtc::fdt::property_value_*>,_std::hash<dtc::fdt::property_value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_368);
  return;
}

Assistant:

void
device_tree::resolve_cross_references(uint32_t &phandle)
{
	for (auto *pv : cross_references)
	{
		node_path path = node_paths[pv->string_data];
		auto p = path.begin();
		auto pe = path.end();
		if (p != pe)
		{
			// Skip the first name in the path.  It's always "", and implicitly /
			for (++p ; p!=pe ; ++p)
			{
				pv->byte_data.push_back('/');
				push_string(pv->byte_data, p->first);
				if (!(p->second.empty()))
				{
					pv->byte_data.push_back('@');
					push_string(pv->byte_data, p->second);
				}
			}
			pv->byte_data.push_back(0);
		}
	}
	std::unordered_map<property_value*, fixup&> phandle_set;
	for (auto &i : fixups)
	{
		phandle_set.insert({&i.val, i});
	}
	std::vector<std::reference_wrapper<fixup>> sorted_phandles;
	root->visit([&](node &n, node *) {
		for (auto &p : n.properties())
		{
			for (auto &v : *p)
			{
				auto i = phandle_set.find(&v);
				if (i != phandle_set.end())
				{
					sorted_phandles.push_back(i->second);
				}
			}
		}
		// Allow recursion
		return node::VISIT_RECURSE;
	}, nullptr);
	assert(sorted_phandles.size() == fixups.size());
	for (auto &i : sorted_phandles)
	{
		string target_name = i.get().val.string_data;
		node_ptr target;
		string possible;
		// If the node name is a path, then look it up by following the path,
		// otherwise jump directly to the named node.
		if (target_name[0] == '/')
		{
			string path;
			target = root;
			std::istringstream ss(target_name);
			string path_element;
			// Read the leading /
			std::getline(ss, path_element, '/');
			// Iterate over path elements
			while (!ss.eof())
			{
				path += '/';
				std::getline(ss, path_element, '/');
				std::istringstream nss(path_element);
				string node_name, node_address;
				std::getline(nss, node_name, '@');
				std::getline(nss, node_address, '@');
				node_ptr next;
				for (auto &c : target->child_nodes())
				{
					if (c->name == node_name)
					{
						if (c->unit_address == node_address)
						{
							next = c;
							break;
						}
						else
						{
							possible = path + c->name;
							if (c->unit_address != string())
							{
								possible += '@';
								possible += c->unit_address;
							}
						}
					}
				}
				path += node_name;
				if (node_address != string())
				{
					path += '@';
					path += node_address;
				}
				target = next;
				if (target == nullptr)
				{
					break;
				}
			}
		}
		else
		{
			target = node_names[target_name];
		}
		if (target == nullptr)
		{
			if (is_plugin)
			{
				unresolved_fixups.push_back(i);
				continue;
			}
			else
			{
				fprintf(stderr, "Failed to find node with label: %s\n", target_name.c_str());
				if (possible != string())
				{
					fprintf(stderr, "Possible intended match: %s\n", possible.c_str());
				}
				valid = 0;
				return;
			}
		}
		// If there is an existing phandle, use it
		property_ptr p = assign_phandle(target, phandle);
		p->begin()->push_to_buffer(i.get().val.byte_data);
		assert(i.get().val.byte_data.size() == 4);
	}
}